

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_node.h
# Opt level: O0

void __thiscall mocker::ast::ForStmt::~ForStmt(ForStmt *this)

{
  ForStmt *this_local;
  
  (this->super_Statement).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__ForStmt_0039e530;
  std::shared_ptr<mocker::ast::Statement>::~shared_ptr(&this->body);
  std::shared_ptr<mocker::ast::Expression>::~shared_ptr(&this->update);
  std::shared_ptr<mocker::ast::Expression>::~shared_ptr(&this->condition);
  std::shared_ptr<mocker::ast::Expression>::~shared_ptr(&this->init);
  Statement::~Statement(&this->super_Statement);
  return;
}

Assistant:

ForStmt(std::shared_ptr<Expression> init,
          std::shared_ptr<Expression> condition,
          std::shared_ptr<Expression> update, std::shared_ptr<Statement> body)
      : init(std::move(init)), condition(std::move(condition)),
        update(std::move(update)), body(std::move(body)) {}